

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

string * __thiscall NDevice::getPrintStr_abi_cxx11_(NDevice *this,int indent)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  int k_5;
  int i;
  int k_4;
  int k_3;
  int k_2;
  int k_1;
  int k;
  string indentStr;
  ostringstream oss;
  size_type in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  string local_200 [32];
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  allocator local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [324];
  int in_stack_ffffffffffffffb4;
  NDeviceChannel *in_stack_ffffffffffffffb8;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"    ",&local_1b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  for (local_1c8 = 0; local_1c8 < in_EDX; local_1c8 = local_1c8 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  std::operator<<((ostream *)local_190,"Printing \'NDevice\'\n");
  for (local_1cc = 0; local_1cc < in_EDX; local_1cc = local_1cc + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar2 = std::operator<<((ostream *)local_190,"    -name       : ");
  poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 8));
  std::operator<<(poVar2,"\n");
  for (local_1d0 = 0; local_1d0 < in_EDX; local_1d0 = local_1d0 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar2 = std::operator<<((ostream *)local_190,"    -numBytes   : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RSI + 0x28));
  std::operator<<(poVar2,"\n");
  for (local_1d4 = 0; local_1d4 < in_EDX; local_1d4 = local_1d4 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar2 = std::operator<<((ostream *)local_190,"    -byteOffset : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RSI + 0x2c));
  std::operator<<(poVar2,"\n");
  for (local_1d8 = 0; local_1d8 < in_EDX; local_1d8 = local_1d8 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar2 = std::operator<<((ostream *)local_190,"    -Channels vector size[");
  sVar3 = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::size
                    ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)(in_RSI + 0x30));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,"]:\n");
  local_1dc = 0;
  while( true ) {
    iVar1 = local_1dc;
    sVar3 = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::size
                      ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)(in_RSI + 0x30));
    if ((int)sVar3 <= iVar1) break;
    for (local_1e0 = 0; local_1e0 < in_EDX; local_1e0 = local_1e0 + 1) {
      std::operator<<((ostream *)local_190,local_1b0);
    }
    poVar2 = std::operator<<((ostream *)local_190,"        - i[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1dc);
    poVar2 = std::operator<<(poVar2,"] : \n");
    std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::at
              ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)in_stack_fffffffffffffd70,
               in_stack_fffffffffffffd68);
    NDeviceChannel::getPrintStr_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    in_stack_fffffffffffffd70 = std::operator<<(poVar2,local_200);
    std::operator<<(in_stack_fffffffffffffd70,"\n");
    std::__cxx11::string::~string(local_200);
    local_1dc = local_1dc + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string NDevice::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'NDevice'\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -name       : " << name << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -numBytes   : " << numBytes << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -byteOffset : " << byteOffset << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -Channels vector size[" << channels.size() << "]:\n";
    for (int i = 0; i < (int)channels.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << channels.at(i).getPrintStr(indent+2) << "\n";
    }
    return(oss.str());
}